

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

void __thiscall Js::CompoundString::AppendCharsSz(CompoundString *this,char16 *s)

{
  bool bVar1;
  size_t charCount;
  ScriptContext *scriptContext;
  size_t len;
  char16 *s_local;
  CompoundString *this_local;
  
  charCount = PAL_wcslen(s);
  bVar1 = IsValidCharCount(charCount);
  if (!bVar1) {
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    JavascriptExceptionOperators::ThrowOutOfMemory(scriptContext);
  }
  AppendChars(this,s,(CharCount)charCount);
  return;
}

Assistant:

void CompoundString::AppendCharsSz(__in_z const char16 *const s)
    {
        size_t len = wcslen(s);
        // We limit the length of the string to MaxCharCount,
        // so just OOM if we are appending a string that exceed this limit already
        if (!IsValidCharCount(len))
        {
            JavascriptExceptionOperators::ThrowOutOfMemory(this->GetScriptContext());
        }
        AppendChars(s, (CharCount)len);
    }